

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::anon_unknown_12::ScanLineProcess::run_mem_decode
          (ScanLineProcess *this,exr_const_context_t ctxt,int pn,char *rawdata,
          DeepFrameBuffer *outfb,int fbY,int fbLastY,
          vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_> *filllist)

{
  exr_result_t eVar1;
  undefined8 uVar2;
  IoExc *this_00;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr *p_Var3;
  char *text;
  exr_attribute_t **in_RCX;
  undefined4 in_EDX;
  ScanLineProcess *in_RSI;
  exr_const_context_t in_RDI;
  undefined4 in_R9D;
  exr_decode_pipeline_t *in_stack_00000030;
  DeepFrameBuffer *in_stack_00000068;
  undefined4 in_stack_00000074;
  exr_decode_pipeline_t *in_stack_000001a0;
  exr_chunk_info_t *in_stack_000001a8;
  int in_stack_000001b4;
  exr_const_context_t in_stack_000001b8;
  char *in_stack_ffffffffffffff98;
  ArgExc *in_stack_ffffffffffffffa0;
  exr_decode_pipeline_t *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  int iVar4;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  DeepFrameBuffer *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  if ((in_RDI->has_nonimage_data & 1) == 0) {
    uVar2 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    __cxa_throw(uVar2,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  eVar1 = exr_decoding_initialize
                    (in_stack_000001b8,in_stack_000001b4,in_stack_000001a8,in_stack_000001a0);
  if (eVar1 == 0) {
    *(ushort *)((long)&in_RDI->alloc_fn + 2) = *(ushort *)((long)&in_RDI->alloc_fn + 2) | 2;
    *(ushort *)((long)&in_RDI->alloc_fn + 2) = *(ushort *)((long)&in_RDI->alloc_fn + 2) | 1;
    if ((in_RDI->is_multipart & 1) != 0) {
      *(ushort *)((long)&in_RDI->alloc_fn + 2) = *(ushort *)((long)&in_RDI->alloc_fn + 2) | 4;
    }
    update_pointers((ScanLineProcess *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
    eVar1 = exr_decoding_choose_default_routines((exr_const_context_t)outfb,fbY,in_stack_00000030);
    if (eVar1 == 0) {
      (in_RDI->first_part).name = (exr_attribute_t *)mem_skip_read_chunk;
      (in_RDI->first_part).attributes.sorted_entries = in_RCX;
      p_Var3 = in_RDI->report_error + (long)in_RCX;
      *(_func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr **)&in_RDI->output_chunk_count
           = p_Var3;
      eVar1 = exr_decoding_run(in_RDI,iVar4,in_stack_ffffffffffffffa8);
      in_RDI->mode = (char)eVar1;
      in_RDI->version = (char)((uint)eVar1 >> 8);
      in_RDI->max_name_length = (char)((uint)eVar1 >> 0x10);
      in_RDI->is_singlepart_tiled = (char)((uint)eVar1 >> 0x18);
      iVar4._0_1_ = in_RDI->mode;
      iVar4._1_1_ = in_RDI->version;
      iVar4._2_1_ = in_RDI->max_name_length;
      iVar4._3_1_ = in_RDI->is_singlepart_tiled;
      if (iVar4 == 0) {
        copy_sample_count(in_RSI,(DeepFrameBuffer *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                          (int)((ulong)p_Var3 >> 0x20));
        if ((in_RDI->is_multipart & 1) == 0) {
          run_fill((ScanLineProcess *)CONCAT44(in_stack_00000074,fbLastY),in_stack_00000068,
                   this._4_4_,
                   (vector<Imf_3_3::DeepSlice,_std::allocator<Imf_3_3::DeepSlice>_> *)ctxt);
        }
        return;
      }
      text = (char *)__cxa_allocate_exception(0x48);
      Iex_3_3::IoExc::IoExc((IoExc *)in_stack_ffffffffffffffa0,text);
      __cxa_throw(text,&Iex_3_3::IoExc::typeinfo,Iex_3_3::IoExc::~IoExc);
    }
    this_00 = (IoExc *)__cxa_allocate_exception(0x48);
    Iex_3_3::IoExc::IoExc(this_00,in_stack_ffffffffffffff98);
    __cxa_throw(this_00,&Iex_3_3::IoExc::typeinfo,Iex_3_3::IoExc::~IoExc);
  }
  uVar2 = __cxa_allocate_exception(0x48);
  Iex_3_3::IoExc::IoExc((IoExc *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  __cxa_throw(uVar2,&Iex_3_3::IoExc::typeinfo,Iex_3_3::IoExc::~IoExc);
}

Assistant:

void ScanLineProcess::run_mem_decode (
        exr_const_context_t ctxt,
        int pn,
        const char *rawdata,
        const DeepFrameBuffer *outfb,
        int fbY,
        int fbLastY,
        const std::vector<DeepSlice> &filllist)
{
    if (!first)
        throw IEX_NAMESPACE::ArgExc ("Expect single-use process");

    if (EXR_ERR_SUCCESS != exr_decoding_initialize (ctxt, pn, &cinfo, &decoder))
        throw IEX_NAMESPACE::IoExc ("Unable to initialize decode pipeline");

    decoder.decode_flags |= EXR_DECODE_NON_IMAGE_DATA_AS_POINTERS;
    decoder.decode_flags |= EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL;
    if (counts_only)
        decoder.decode_flags |= EXR_DECODE_SAMPLE_DATA_ONLY;

    update_pointers (outfb, fbY, fbLastY);

    if (EXR_ERR_SUCCESS !=
        exr_decoding_choose_default_routines (ctxt, pn, &decoder))
    {
        throw IEX_NAMESPACE::IoExc ("Unable to choose decoder routines");
    }
    decoder.read_fn = &mem_skip_read_chunk;
    // leave alloc sizes at 0 such that the decode pipeline doesn't
    // attempt to free, making it safe to cast const away
    decoder.packed_sample_count_table = const_cast<char*> (rawdata);
    rawdata += cinfo.sample_count_table_size;
    decoder.packed_buffer = const_cast<char*> (rawdata);

    last_decode_err = exr_decoding_run (ctxt, pn, &decoder);
    if (EXR_ERR_SUCCESS != last_decode_err)
        throw IEX_NAMESPACE::IoExc ("Unable to run decoder");

    copy_sample_count (outfb, fbY);

    if (counts_only)
        return;

    run_fill (outfb, fbY, filllist);
}